

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void load(char *filename)

{
  int iVar1;
  FILE *__stream;
  uint local_1c;
  uint i;
  FILE *fd;
  char *filename_local;
  
  local_1c = 0;
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    while (iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%d",C + local_1c);
      local_1c = local_1c + 1;
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"error opening file\n");
  getchar();
  exit(-1);
}

Assistant:

void load(char *filename) {
	FILE *fd; unsigned int i = 0;
	fd = fopen(filename, "r");
	if (fd == NULL) { 
		fprintf(stderr,"error opening file\n"); 
		getchar();
		exit(-1);
	}
	while (!feof(fd)) {
		fscanf(fd,"%d", &C[i++]);
	}
	//fprintf(stderr,"loaded %d instructions\n", i-1);
	fclose(fd);
}